

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseBandwidth.cpp
# Opt level: O2

void __thiscall
tonk::ReceiverBandwidthControl::OnProcessedDatagram
          (ReceiverBandwidthControl *this,DatagramInfo *datagram)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  Counter<unsigned_int,_32U> local_18;
  Counter<unsigned_int,_32U> local_14;
  
  bVar1 = BandwidthEstimator::UpdateOnDatagram(&this->Bandwidth,datagram);
  local_14.Value = (this->Bandwidth).Measurement.MinReceiveSendDeltaTS24.Value;
  siamese::
  WindowedMinMax<Counter<unsigned_int,_32U>,_siamese::WindowedMinCompare<Counter<unsigned_int,_32U>_>_>
  ::Update(&this->MinOWD,&local_14,(this->Bandwidth).Measurement.TimestampUsec,
           (ulong)this->MinOWD_WindowUsec);
  _local_18 = CONCAT44(local_14.Value,(this->Bandwidth).Measurement.MinReceiveSendDeltaTS24.Value);
  siamese::
  WindowedMinMax<Counter<unsigned_int,_32U>,_siamese::WindowedMinCompare<Counter<unsigned_int,_32U>_>_>
  ::Update(&this->RecentOWD,&local_18,(this->Bandwidth).Measurement.TimestampUsec,
           (ulong)this->RecentOWD_WindowUsec);
  if (bVar1) {
    siamese::WindowedMinMax<unsigned_int,_siamese::WindowedMaxCompare<unsigned_int>_>::Update
              (&this->RecentMaxBW,(this->Bandwidth).Measurement.LatestProbeBPS,
               (this->Bandwidth).Measurement.TimestampUsec,(ulong)this->RecentOWD_WindowUsec);
    uVar2 = (this->Bandwidth).Measurement.SmoothedMinTripUsec;
    uVar3 = 30000;
    if (0xea61 < uVar2) {
      uVar3 = uVar2 >> 1;
    }
    uVar2 = (this->Bandwidth).InterPacketGap.SmoothedMaxUsec * 2;
    if (uVar2 < uVar3) {
      uVar2 = uVar3;
    }
    this->RecentOWD_WindowUsec = uVar2;
  }
  return;
}

Assistant:

void ReceiverBandwidthControl::OnProcessedDatagram(const DatagramInfo& datagram)
{
    // Update BW estimate
    const bool updated = Bandwidth.UpdateOnDatagram(datagram);

    // Update minimum OWD
    MinOWD.Update(
        Bandwidth.Measurement.MinReceiveSendDeltaTS24,
        Bandwidth.Measurement.TimestampUsec,
        MinOWD_WindowUsec);

    // Update recent OWD
    RecentOWD.Update(
        Bandwidth.Measurement.MinReceiveSendDeltaTS24,
        Bandwidth.Measurement.TimestampUsec,
        RecentOWD_WindowUsec);

    // If bandwidth estimator has not updated yet:
    if (!updated) {
        return;
    }

    // Update recent max bandwidth
    RecentMaxBW.Update(
        Bandwidth.Measurement.LatestProbeBPS,
        Bandwidth.Measurement.TimestampUsec,
        RecentOWD_WindowUsec);

    // The minimum window must include a few timer ticks
    unsigned recent_window_usec = protocol::kSendTimerTickIntervalUsec * 6;

    // Must wait longer than the minimum OWD / 2
    const unsigned min_trip_usec = Bandwidth.Measurement.SmoothedMinTripUsec / 2;
    if (recent_window_usec < min_trip_usec) {
        recent_window_usec = min_trip_usec;
    }

    // Must wait longer than two (longest) inter-packet gaps
    const unsigned min_ipg2_usec = Bandwidth.InterPacketGap.Get() * 2;
    if (recent_window_usec < min_ipg2_usec) {
        recent_window_usec = min_ipg2_usec;
    }

    // Probe time must be longer than the window to be detected
    RecentOWD_WindowUsec = recent_window_usec;
}